

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void __thiscall Fl_Tooltip::enter_(Fl_Tooltip *this,Fl_Widget *w)

{
  int iVar1;
  int iVar2;
  char *t;
  long lVar3;
  Fl_Group *pFVar4;
  int x;
  
  x = (int)w;
  if (this != (Fl_Tooltip *)0x0) {
    lVar3 = (**(code **)(*(long *)this + 0x40))();
    pFVar4 = (Fl_Group *)this;
    if ((lVar3 != 0) && (((byte)this[0x61] & 0x20) != 0)) {
      iVar1 = *(int *)(this + 0x20);
      iVar2 = *(int *)(this + 0x24);
      Fl_TooltipBox::layout((Fl_TooltipBox *)this);
      if ((*(int *)(this + 0x20) == iVar1) && (*(int *)(this + 0x24) == iVar2)) {
        return;
      }
    }
    do {
      if (pFVar4 == (Fl_Group *)widget_) {
        return;
      }
      t = (pFVar4->super_Fl_Widget).tooltip_;
      if (t != (char *)0x0) {
        enter_area((Fl_Widget *)this,x,0,(int)pFVar4,*(int *)(this + 0x2c),t);
        return;
      }
      pFVar4 = (pFVar4->super_Fl_Widget).parent_;
    } while (pFVar4 != (Fl_Group *)0x0);
  }
  exit_((Fl_Widget *)0x0);
  return;
}

Assistant:

void Fl_Tooltip::enter_(Fl_Widget* w) {
#ifdef DEBUG
  printf("Fl_Tooltip::enter_(w=%p)\n", w);
  printf("    window=%p\n", window);
#endif // DEBUG
  if (w && w->as_window() && ((Fl_Window*)w)->tooltip_window()) {
    // Fix STR #2650: if there's no better place for a tooltip window, don't move it.
    int oldx = w->x();
    int oldy = w->y();
    ((Fl_TooltipBox*)w)->layout();
    if (w->x() == oldx && w->y() == oldy) return;
  }
  // find the enclosing group with a tooltip:
  Fl_Widget* tw = w;
  for (;;) {
    if (!tw) {exit_(0); return;}
    if (tw == widget_) return;
    if (tw->tooltip()) break;
    tw = tw->parent();
  }
  enter_area(w, 0, 0, w->w(), w->h(), tw->tooltip());
}